

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNotationDecl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLNotationDecl::serialize(XMLNotationDecl *this,XSerializeEngine *serEng)

{
  bool bVar1;
  XSerializeEngine *serEng_local;
  XMLNotationDecl *this_local;
  
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    XSerializeEngine::writeSize(serEng,this->fId);
    XSerializeEngine::operator<<(serEng,this->fNameSpaceId);
    XSerializeEngine::writeString(serEng,this->fName,0,false);
    XSerializeEngine::writeString(serEng,this->fPublicId,0,false);
    XSerializeEngine::writeString(serEng,this->fSystemId,0,false);
    XSerializeEngine::writeString(serEng,this->fBaseURI,0,false);
  }
  else {
    XSerializeEngine::readSize(serEng,&this->fId);
    XSerializeEngine::operator>>(serEng,&this->fNameSpaceId);
    XSerializeEngine::readString(serEng,&this->fName);
    XSerializeEngine::readString(serEng,&this->fPublicId);
    XSerializeEngine::readString(serEng,&this->fSystemId);
    XSerializeEngine::readString(serEng,&this->fBaseURI);
  }
  return;
}

Assistant:

void XMLNotationDecl::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        serEng.writeSize (fId);
        serEng<<fNameSpaceId;
        serEng.writeString(fName);
        serEng.writeString(fPublicId);
        serEng.writeString(fSystemId);
        serEng.writeString(fBaseURI);
    }
    else
    {
        serEng.readSize (fId);
        serEng>>fNameSpaceId;
        serEng.readString(fName);
        serEng.readString(fPublicId);
        serEng.readString(fSystemId);
        serEng.readString(fBaseURI);
    }
}